

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<int>::GetSub(TPZMatrix<int> *this,TPZVec<long> *indices,TPZFMatrix<int> *block)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = indices->fNElements;
  if (0 < lVar1) {
    lVar3 = 0;
    do {
      lVar4 = 0;
      do {
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,indices->fStore[lVar3],indices->fStore[lVar4]);
        if (((block->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow <= lVar3) ||
           ((block->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        block->fElem[(block->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow * lVar4 + lVar3] = iVar2
        ;
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
      lVar3 = lVar3 + 1;
    } while (lVar3 != lVar1);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}